

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squared_loss.h
# Opt level: O2

string * __thiscall
xLearn::SquaredLoss::loss_type_abi_cxx11_(string *__return_storage_ptr__,SquaredLoss *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"mse_loss",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string loss_type() { return "mse_loss"; }